

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

bool __thiscall kj::StringPtr::startsWith(StringPtr *this,StringPtr *other)

{
  ulong uVar1;
  int iVar2;
  
  uVar1 = (other->content).size_;
  if ((this->content).size_ < uVar1) {
    return false;
  }
  iVar2 = bcmp((this->content).ptr,(other->content).ptr,uVar1 - 1);
  return iVar2 == 0;
}

Assistant:

inline constexpr size_t size() const { return size_; }